

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O0

int WebRtc_MoveReadPtr(RingBuffer *self,int element_count)

{
  int iVar1;
  size_t sVar2;
  int local_28;
  int read_pos;
  int readable_elements;
  int free_elements;
  int element_count_local;
  RingBuffer *self_local;
  
  if (self == (RingBuffer *)0x0) {
    self_local._4_4_ = 0;
  }
  else {
    sVar2 = WebRtc_available_write(self);
    iVar1 = (int)sVar2;
    sVar2 = WebRtc_available_read(self);
    readable_elements = element_count;
    if ((int)sVar2 < element_count) {
      readable_elements = (int)sVar2;
    }
    if (SBORROW4(readable_elements,-iVar1) != readable_elements + iVar1 < 0) {
      readable_elements = -iVar1;
    }
    local_28 = readable_elements + (int)self->read_pos;
    if ((int)self->element_count < local_28) {
      local_28 = local_28 - (int)self->element_count;
      self->rw_wrap = SAME_WRAP;
    }
    if (local_28 < 0) {
      local_28 = (int)self->element_count + local_28;
      self->rw_wrap = DIFF_WRAP;
    }
    self->read_pos = (long)local_28;
    self_local._4_4_ = readable_elements;
  }
  return self_local._4_4_;
}

Assistant:

int WebRtc_MoveReadPtr(RingBuffer* self, int element_count) {
  if (!self) {
    return 0;
  }

  {
    // We need to be able to take care of negative changes, hence use "int"
    // instead of "size_t".
    const int free_elements = (int) WebRtc_available_write(self);
    const int readable_elements = (int) WebRtc_available_read(self);
    int read_pos = (int) self->read_pos;

    if (element_count > readable_elements) {
      element_count = readable_elements;
    }
    if (element_count < -free_elements) {
      element_count = -free_elements;
    }

    read_pos += element_count;
    if (read_pos > (int) self->element_count) {
      // Buffer wrap around. Restart read position and wrap indicator.
      read_pos -= (int) self->element_count;
      self->rw_wrap = SAME_WRAP;
    }
    if (read_pos < 0) {
      // Buffer wrap around. Restart read position and wrap indicator.
      read_pos += (int) self->element_count;
      self->rw_wrap = DIFF_WRAP;
    }

    self->read_pos = (size_t) read_pos;

    return element_count;
  }
}